

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test::TestBody
          (ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_10;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_3a9;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  basic_string_view<char,_std::char_traits<char>_> *local_398;
  size_type local_390;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_388;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_369;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  basic_string_view<char,_std::char_traits<char>_> *local_358;
  size_type local_350;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_348;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_329;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  basic_string_view<char,_std::char_traits<char>_> *local_318;
  size_type local_310;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_308;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_2e9;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  undefined8 local_2d8;
  char *pcStack_2d0;
  iterator local_2c8;
  size_type local_2c0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2b8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_299;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  undefined8 local_288;
  char *pcStack_280;
  iterator local_278;
  size_type local_270;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_268;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_249;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  undefined8 local_238;
  char *pcStack_230;
  iterator local_228;
  size_type local_220;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_218;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_1f9;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  undefined8 local_1e8;
  char *pcStack_1e0;
  iterator local_1d8;
  size_type local_1d0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1c8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_1a9;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined8 local_198;
  char *pcStack_190;
  iterator local_188;
  size_type local_180;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_178;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_159;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  undefined8 local_148;
  char *pcStack_140;
  iterator local_138;
  size_type local_130;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_128;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_109;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined8 local_f8;
  char *pcStack_f0;
  iterator local_e8;
  size_type local_e0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_d8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_b9;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined8 local_a8;
  char *pcStack_a0;
  iterator local_98;
  size_type local_90;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_88;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined8 local_48;
  char *pcStack_40;
  iterator local_38;
  size_type local_30;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_28;
  ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test *local_10;
  ArenaTest_AllConstructibleAndDestructibleCombinationsWorkCorrectly_Test *this_local;
  
  local_48 = 3;
  pcStack_40 = "~()";
  local_58._M_len = 2;
  local_58._M_str = "()";
  local_38 = &local_58;
  local_30 = 2;
  local_10 = this;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_59);
  __l_10._M_len = local_30;
  __l_10._M_array = local_38;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_28,__l_10,&local_59);
  local_a8 = 3;
  pcStack_a0 = "~()";
  local_b8._M_len = 10;
  local_b8._M_str = "(const T&)";
  local_98 = &local_b8;
  local_90 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_b9);
  __l_09._M_len = local_90;
  __l_09._M_array = local_98;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_88,__l_09,&local_b9);
  local_f8 = 3;
  pcStack_f0 = "~()";
  local_108._M_len = 5;
  local_108._M_str = "(int)";
  local_e8 = &local_108;
  local_e0 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_109);
  __l_08._M_len = local_e0;
  __l_08._M_array = local_e8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_d8,__l_08,&local_109);
  TestCtorAndDtorTraits<false,false>(&local_28,&local_88,&local_d8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_d8);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_109);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_88);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_b9);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_28);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_59);
  local_148 = 3;
  pcStack_140 = "~()";
  local_158._M_len = 2;
  local_158._M_str = "()";
  local_138 = &local_158;
  local_130 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_159);
  __l_07._M_len = local_130;
  __l_07._M_array = local_138;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_128,__l_07,&local_159);
  local_198 = 3;
  pcStack_190 = "~()";
  local_1a8._M_len = 10;
  local_1a8._M_str = "(const T&)";
  local_188 = &local_1a8;
  local_180 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_1a9);
  __l_06._M_len = local_180;
  __l_06._M_array = local_188;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_178,__l_06,&local_1a9);
  local_1e8 = 3;
  pcStack_1e0 = "~()";
  local_1f8._M_len = 5;
  local_1f8._M_str = "(int)";
  local_1d8 = &local_1f8;
  local_1d0 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_1f9);
  __l_05._M_len = local_1d0;
  __l_05._M_array = local_1d8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1c8,__l_05,&local_1f9);
  TestCtorAndDtorTraits<false,true>(&local_128,&local_178,&local_1c8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_1c8);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_1f9);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_178);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_1a9);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_128);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_159);
  local_238 = 3;
  pcStack_230 = "~()";
  local_248._M_len = 7;
  local_248._M_str = "(Arena)";
  local_228 = &local_248;
  local_220 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_249);
  __l_04._M_len = local_220;
  __l_04._M_array = local_228;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_218,__l_04,&local_249);
  local_288 = 3;
  pcStack_280 = "~()";
  local_298._M_len = 0x11;
  local_298._M_str = "(Arena, const T&)";
  local_278 = &local_298;
  local_270 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_299);
  __l_03._M_len = local_270;
  __l_03._M_array = local_278;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_268,__l_03,&local_299);
  local_2d8 = 3;
  pcStack_2d0 = "~()";
  local_2e8._M_len = 0xc;
  local_2e8._M_str = "(Arena, int)";
  local_2c8 = &local_2e8;
  local_2c0 = 2;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_2e9);
  __l_02._M_len = local_2c0;
  __l_02._M_array = local_2c8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2b8,__l_02,&local_2e9);
  TestCtorAndDtorTraits<true,false>(&local_218,&local_268,&local_2b8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_2b8);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_2e9);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_268);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_299);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_218);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_249);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328,"(Arena)");
  local_310 = 1;
  local_318 = &local_328;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_329);
  __l_01._M_len = local_310;
  __l_01._M_array = local_318;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_308,__l_01,&local_329);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_368,"(Arena, const T&)");
  local_350 = 1;
  local_358 = &local_368;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_369);
  __l_00._M_len = local_350;
  __l_00._M_array = local_358;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_348,__l_00,&local_369);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a8,"(Arena, int)");
  local_390 = 1;
  local_398 = &local_3a8;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_3a9);
  __l._M_len = local_390;
  __l._M_array = local_398;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_388,__l,&local_3a9);
  TestCtorAndDtorTraits<true,true>(&local_308,&local_348,&local_388);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_388);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_3a9);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_348);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_369);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_308);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_329);
  return;
}

Assistant:

TEST(ArenaTest, AllConstructibleAndDestructibleCombinationsWorkCorrectly) {
  TestCtorAndDtorTraits<false, false>({"()", "~()"}, {"(const T&)", "~()"},
                                      {"(int)", "~()"});
  // If the object is not arena constructible, then the destructor is always
  // called even if marked as skippable.
  TestCtorAndDtorTraits<false, true>({"()", "~()"}, {"(const T&)", "~()"},
                                     {"(int)", "~()"});

  // Some types are arena constructible but we can't skip the destructor. Those
  // are constructed with an arena but still destroyed.
  TestCtorAndDtorTraits<true, false>({"(Arena)", "~()"},
                                     {"(Arena, const T&)", "~()"},
                                     {"(Arena, int)", "~()"});
  TestCtorAndDtorTraits<true, true>({"(Arena)"}, {"(Arena, const T&)"},
                                    {"(Arena, int)"});
}